

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementLog.cpp
# Opt level: O0

void __thiscall Rml::Debugger::ElementLog::~ElementLog(ElementLog *this)

{
  ~ElementLog((ElementLog *)&this[-1].log_types[2].alert_contents.field_2);
  return;
}

Assistant:

ElementLog::~ElementLog()
{
	RemoveEventListener(EventId::Click, this);

	if (beacon && beacon->GetFirstChild())
		beacon->GetFirstChild()->RemoveEventListener(EventId::Click, this);

	if (beacon && beacon->GetParentNode())
		beacon->GetParentNode()->RemoveChild(beacon);

	if (message_content)
	{
		message_content->RemoveEventListener(EventId::Resize, this);
	}
}